

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

ssize_t nghttp2_hd_deflate_hd
                  (nghttp2_hd_deflater *deflater,uint8_t *buf,size_t buflen,nghttp2_nv *nv,
                  size_t nvlen)

{
  int iVar1;
  nghttp2_mem *mem;
  undefined1 local_78 [4];
  int rv;
  nghttp2_bufs bufs;
  size_t nvlen_local;
  nghttp2_nv *nv_local;
  size_t buflen_local;
  uint8_t *buf_local;
  nghttp2_hd_deflater *deflater_local;
  
  bufs.offset = nvlen;
  iVar1 = nghttp2_bufs_wrap_init((nghttp2_bufs *)local_78,buf,buflen,(deflater->ctx).mem);
  if (iVar1 == 0) {
    iVar1 = nghttp2_hd_deflate_hd_bufs(deflater,(nghttp2_bufs *)local_78,nv,bufs.offset);
    deflater_local = (nghttp2_hd_deflater *)nghttp2_bufs_len((nghttp2_bufs *)local_78);
    nghttp2_bufs_wrap_free((nghttp2_bufs *)local_78);
    if (iVar1 == -0x1f6) {
      deflater_local = (nghttp2_hd_deflater *)0xfffffffffffffdf3;
    }
    else if (iVar1 != 0) {
      deflater_local = (nghttp2_hd_deflater *)(long)iVar1;
    }
  }
  else {
    deflater_local = (nghttp2_hd_deflater *)(long)iVar1;
  }
  return (ssize_t)deflater_local;
}

Assistant:

ssize_t nghttp2_hd_deflate_hd(nghttp2_hd_deflater *deflater, uint8_t *buf,
                              size_t buflen, const nghttp2_nv *nv,
                              size_t nvlen) {
  nghttp2_bufs bufs;
  int rv;
  nghttp2_mem *mem;

  mem = deflater->ctx.mem;

  rv = nghttp2_bufs_wrap_init(&bufs, buf, buflen, mem);

  if (rv != 0) {
    return rv;
  }

  rv = nghttp2_hd_deflate_hd_bufs(deflater, &bufs, nv, nvlen);

  buflen = nghttp2_bufs_len(&bufs);

  nghttp2_bufs_wrap_free(&bufs);

  if (rv == NGHTTP2_ERR_BUFFER_ERROR) {
    return NGHTTP2_ERR_INSUFF_BUFSIZE;
  }

  if (rv != 0) {
    return rv;
  }

  return (ssize_t)buflen;
}